

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  TextRecorder *this;
  TextRecordMemento *m;
  TextRecordMemento *m_00;
  long *local_40 [2];
  long local_30 [2];
  
  this = (TextRecorder *)operator_new(0x28);
  TextRecorder::TextRecorder(this);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"sentence 1","");
  std::__cxx11::string::_M_assign((string *)&this->_text);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  m = TextRecorder::createMemo(this);
  TextRecorder::print(this);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"sentence 2","");
  std::__cxx11::string::_M_assign((string *)&this->_text);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  m_00 = TextRecorder::createMemo(this);
  TextRecorder::print(this);
  TextRecorder::loadMemo(this,m);
  TextRecorder::print(this);
  TextRecorder::loadMemo(this,m_00);
  TextRecorder::print(this);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	TextRecorder* recorder = new TextRecorder;

	recorder->setText("sentence 1");
	TextRecordMemento* m1 = recorder->createMemo();
	recorder->print();

	recorder->setText("sentence 2");
	TextRecordMemento* m2 = recorder->createMemo();
	recorder->print();

	recorder->loadMemo(m1);
	recorder->print();

	recorder->loadMemo(m2);
	recorder->print();

	return 0;
}